

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  _Bool _Var1;
  uint8_t uVar2;
  roaring_bitmap_t *prVar3;
  container_t *pcVar4;
  container_t *c_00;
  bitset_container_t *pbVar5;
  bitset_container_t *pbVar6;
  byte in_DL;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2_1;
  container_t *c1_1;
  container_t *newc1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  int length2;
  int length1;
  uint8_t result_type;
  uint8_t in_stack_ffffffffffffff3f;
  container_t *in_stack_ffffffffffffff40;
  roaring_array_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar7;
  undefined4 in_stack_ffffffffffffff54;
  int iVar8;
  roaring_bitmap_t *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  _Bool local_71;
  ushort local_3e;
  ushort local_3c;
  uint8_t local_3a;
  uint8_t local_39;
  int local_38;
  int local_34;
  roaring_bitmap_t *local_30;
  int local_24;
  int local_20;
  undefined1 local_1a;
  byte local_19;
  roaring_array_t *local_18;
  roaring_array_t *local_10;
  roaring_bitmap_t *local_8;
  
  local_19 = in_DL & 1;
  local_1a = 0;
  local_20 = ((roaring_array_t *)&in_RDI->size)->size;
  local_24 = ((roaring_array_t *)&in_RSI->size)->size;
  if (local_20 == 0) {
    local_8 = roaring_bitmap_copy(in_stack_ffffffffffffff58);
  }
  else if (local_24 == 0) {
    local_8 = roaring_bitmap_copy(in_stack_ffffffffffffff58);
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    prVar3 = roaring_bitmap_create_with_capacity
                       ((uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    local_30 = prVar3;
    _Var1 = is_cow((roaring_bitmap_t *)local_10);
    local_71 = true;
    if (!_Var1) {
      local_71 = is_cow((roaring_bitmap_t *)local_18);
    }
    roaring_bitmap_set_copy_on_write(prVar3,local_71);
    local_34 = 0;
    local_38 = 0;
    local_3c = ra_get_key_at_index(local_10,0);
    local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
    while( true ) {
      while (local_3c != local_3e) {
        if (local_3c < local_3e) {
          ra_get_container_at_index(local_10,(uint16_t)local_34,&local_39);
          is_cow((roaring_bitmap_t *)local_10);
          pcVar4 = get_copy_of_container
                             (in_stack_ffffffffffffff58,
                              (uint8_t *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
          _Var1 = is_cow((roaring_bitmap_t *)local_10);
          if (_Var1) {
            ra_set_container_at_index(local_10,local_34,pcVar4,local_39);
          }
          ra_append((roaring_array_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                    ,(uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff3f);
          local_34 = local_34 + 1;
          if (local_34 == local_20) goto LAB_0010575a;
          local_3c = ra_get_key_at_index(local_10,(uint16_t)local_34);
        }
        else {
          ra_get_container_at_index(local_18,(uint16_t)local_38,&local_3a);
          is_cow((roaring_bitmap_t *)local_18);
          pcVar4 = get_copy_of_container
                             (in_stack_ffffffffffffff58,
                              (uint8_t *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
          _Var1 = is_cow((roaring_bitmap_t *)local_18);
          if (_Var1) {
            ra_set_container_at_index(local_18,local_38,pcVar4,local_3a);
          }
          ra_append((roaring_array_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                    ,(uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff3f);
          local_38 = local_38 + 1;
          if (local_38 == local_24) goto LAB_0010575a;
          local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
        }
      }
      pcVar4 = ra_get_container_at_index(local_10,(uint16_t)local_34,&local_39);
      c_00 = ra_get_container_at_index(local_18,(uint16_t)local_38,&local_3a);
      if ((((local_19 & 1) == 0) || (uVar2 = get_container_type(pcVar4,local_39), uVar2 == '\x01'))
         || (uVar2 = get_container_type(c_00,local_3a), uVar2 == '\x01')) {
        container_lazy_or((container_t *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (uint8_t)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                          in_stack_ffffffffffffff58,
                          (uint8_t)((uint)in_stack_ffffffffffffff54 >> 0x18),
                          (uint8_t *)in_stack_ffffffffffffff48);
      }
      else {
        container_mutable_unwrap_shared(pcVar4,&local_39);
        pbVar5 = container_to_bitset(in_stack_ffffffffffffff48,
                                     (uint8_t)((ulong)in_stack_ffffffffffffff40 >> 0x38));
        local_39 = '\x01';
        pbVar6 = (bitset_container_t *)
                 container_lazy_ior((container_t *)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                    (uint8_t)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                                    in_stack_ffffffffffffff58,
                                    (uint8_t)((uint)in_stack_ffffffffffffff54 >> 0x18),
                                    (uint8_t *)in_stack_ffffffffffffff48);
        if (pbVar6 != pbVar5) {
          container_free(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
        }
      }
      ra_append((roaring_array_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                (uint16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff3f);
      local_34 = local_34 + 1;
      local_38 = local_38 + 1;
      if ((local_34 == local_20) || (local_38 == local_24)) break;
      local_3c = ra_get_key_at_index(local_10,(uint16_t)local_34);
      local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
    }
LAB_0010575a:
    if (local_34 == local_20) {
      is_cow((roaring_bitmap_t *)local_18);
      ra_append_copy_range
                ((roaring_array_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,(int32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 (int32_t)in_stack_ffffffffffffff40,(_Bool)in_stack_ffffffffffffff3f);
    }
    else if (local_38 == local_24) {
      prVar3 = local_30;
      iVar7 = local_34;
      iVar8 = local_20;
      is_cow((roaring_bitmap_t *)local_10);
      ra_append_copy_range
                ((roaring_array_t *)CONCAT44(iVar8,iVar7),local_10,(int32_t)((ulong)prVar3 >> 0x20),
                 (int32_t)prVar3,(_Bool)in_stack_ffffffffffffff3f);
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)) {
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2, &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}